

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Maybe<capnp::Schema> __thiscall capnp::compiler::Compiler::Node::getBootstrapSchema(Node *this)

{
  byte bVar1;
  long lVar2;
  Schema SVar3;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar4;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_00;
  long in_RSI;
  Reader *reader;
  Maybe<capnp::Schema> MVar5;
  Resolver local_20;
  
  if (*(char *)(in_RSI + 0x188) == '\x01') {
    reader = (Reader *)(in_RSI + 400);
    lVar2 = **(long **)(in_RSI + 8);
LAB_00115b52:
    SVar3 = SchemaLoader::loadOnce((SchemaLoader *)(lVar2 + 0x188),reader);
    *(undefined1 *)&(this->super_Resolver)._vptr_Resolver = 1;
    aVar4 = extraout_RDX;
LAB_00115b5a:
    this->module = (CompiledModule *)SVar3.raw;
  }
  else {
    getContent((Node *)&stack0xffffffffffffffe0,(State)in_RSI);
    aVar4 = extraout_RDX_00;
    if (local_20._vptr_Resolver != (_func_int **)0x0) {
      bVar1 = *(byte *)(local_20._vptr_Resolver + 0x12);
      if ((*(int *)local_20._vptr_Resolver != 3) || ((bVar1 & 1) != 0)) {
        *(byte *)&(this->super_Resolver)._vptr_Resolver = bVar1;
        if ((bVar1 & 1) == 0) goto LAB_00115bba;
        SVar3.raw = (RawBrandedSchema *)local_20._vptr_Resolver[0x13];
        goto LAB_00115b5a;
      }
      if (*(char *)(local_20._vptr_Resolver + 0x14) == '\x01') {
        reader = (Reader *)(local_20._vptr_Resolver + 0x15);
        lVar2 = **(long **)(in_RSI + 8);
        goto LAB_00115b52;
      }
    }
    *(undefined1 *)&(this->super_Resolver)._vptr_Resolver = 0;
  }
LAB_00115bba:
  MVar5.ptr.field_1 = aVar4;
  MVar5.ptr._0_8_ = this;
  return (Maybe<capnp::Schema>)MVar5.ptr;
}

Assistant:

kj::Maybe<Schema> Compiler::Node::getBootstrapSchema() {
  KJ_IF_SOME(schema, loadedFinalSchema) {
    // We don't need to rebuild the bootstrap schema if we already have a final schema.
    return module->getCompiler().getWorkspace().bootstrapLoader.loadOnce(schema);
  } else KJ_IF_SOME(content, getContent(Content::BOOTSTRAP)) {
    if (content.state == Content::FINISHED && content.bootstrapSchema == kj::none) {
      // The bootstrap schema was discarded.  Copy it from the final schema.
      // (We can't just return the final schema because using it could trigger schema loader
      // callbacks that would deadlock.)
      KJ_IF_SOME(finalSchema, content.finalSchema) {
        return module->getCompiler().getWorkspace().bootstrapLoader.loadOnce(finalSchema);
      } else {
        return kj::none;
      }
    } else {
      return content.bootstrapSchema;
    }